

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O1

void __thiscall
Item::Item(Item *this,string *n,int t,int spT,int c,int at,int def,int hon,int bon,int bc,int d,
          string *txt)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + n->_M_string_length)
  ;
  GreenCard::GreenCard(&this->super_GreenCard,&local_50,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_GreenCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_00118290;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->typeI = spT;
  this->tapped = false;
  this->cost = c;
  this->attackBonus = at;
  this->defenseBonus = def;
  this->minimumHonor = hon;
  std::__cxx11::string::_M_assign((string *)&this->cardText);
  this->effectBonus = bon;
  this->effectCost = bc;
  this->durability = d;
  return;
}

Assistant:

Item::Item(string n, int t, int spT, int c, int at, int def, int hon, int bon, int bc, int d, string txt) : GreenCard{n, t}
{
    name = n;
    typeI = Items(spT);
    tapped = false;

    cost = c;
    attackBonus = at;
    defenseBonus = def;
    minimumHonor = hon;
    cardText = txt;

    effectBonus = bon;
    effectCost = bc;

    durability = d;
}